

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

void Au_ManAddNtk(Au_Man_t *pMan,Au_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  
  iVar2 = Au_ManFindNtk(pMan,p->pName);
  if (iVar2 == -1) {
    p->pMan = pMan;
    pMan->nRefs = pMan->nRefs + 1;
    uVar1 = (pMan->vNtks).nSize;
    p->Id = uVar1;
    if (uVar1 == (pMan->vNtks).nCap) {
      if ((int)uVar1 < 0x10) {
        ppvVar3 = (pMan->vNtks).pArray;
        if (ppvVar3 == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(ppvVar3,0x80);
        }
        (pMan->vNtks).pArray = ppvVar3;
        (pMan->vNtks).nCap = 0x10;
      }
      else {
        ppvVar3 = (pMan->vNtks).pArray;
        if (ppvVar3 == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(ppvVar3,(ulong)uVar1 << 4);
        }
        (pMan->vNtks).pArray = ppvVar3;
        (pMan->vNtks).nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar3 = (pMan->vNtks).pArray;
    }
    iVar2 = (pMan->vNtks).nSize;
    (pMan->vNtks).nSize = iVar2 + 1;
    ppvVar3[iVar2] = p;
    return;
  }
  __assert_fail("Au_ManFindNtk(pMan, Au_NtkName(p)) == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                ,0x174,"void Au_ManAddNtk(Au_Man_t *, Au_Ntk_t *)");
}

Assistant:

void Au_ManAddNtk( Au_Man_t * pMan, Au_Ntk_t * p )
{
    assert( Au_ManFindNtk(pMan, Au_NtkName(p)) == -1 );
    p->pMan = pMan; pMan->nRefs++;
    p->Id = Vec_PtrSize( &pMan->vNtks );
    Vec_PtrPush( &pMan->vNtks, p );
}